

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O3

void __thiscall CMU462::OSDText::del_line(OSDText *this,int line_id)

{
  pointer pcVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  pointer pOVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pOVar7;
  
  pOVar7 = (this->lines).super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pOVar7 == (this->lines).
                  super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return;
    }
    if (pOVar7->id == line_id) break;
    pOVar7 = pOVar7 + 1;
  }
  pOVar5 = (this->lines).super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pOVar7 + 1 != pOVar5) && (uVar4 = (long)pOVar5 - (long)(pOVar7 + 1), 0 < (long)uVar4)) {
    uVar4 = uVar4 / 0x48 + 1;
    do {
      pOVar7->y = pOVar7[1].y;
      fVar2 = pOVar7[1].x;
      pOVar7->id = pOVar7[1].id;
      pOVar7->x = fVar2;
      std::__cxx11::string::operator=((string *)&pOVar7->text,(string *)&pOVar7[1].text);
      fVar2 = pOVar7[1].color.r;
      fVar3 = pOVar7[1].color.g;
      pOVar7->size = pOVar7[1].size;
      (pOVar7->color).r = fVar2;
      (pOVar7->color).g = fVar3;
      fVar2 = pOVar7[1].color.a;
      (pOVar7->color).b = pOVar7[1].color.b;
      (pOVar7->color).a = fVar2;
      uVar4 = uVar4 - 1;
      pOVar7 = pOVar7 + 1;
    } while (1 < uVar4);
    pOVar5 = (this->lines).super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  (this->lines).super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_finish = pOVar5 + -1;
  pcVar1 = pOVar5[-1].text._M_dataplus._M_p;
  paVar6 = &pOVar5[-1].text.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar6) {
    operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OSDText::del_line(int line_id) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      lines.erase(it);
      break;
    }
    ++it;
  }
}